

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm3.c
# Opt level: O0

void sm3_init(sm3_context *ctx)

{
  sm3_context *ctx_local;
  
  ctx->total[0] = 0;
  ctx->total[1] = 0;
  ctx->state[0] = 0x7380166f;
  ctx->state[1] = 0x4914b2b9;
  ctx->state[2] = 0x172442d7;
  ctx->state[3] = 0xda8a0600;
  ctx->state[4] = 0xa96f30bc;
  ctx->state[5] = 0x163138aa;
  ctx->state[6] = 0xe38dee4d;
  ctx->state[7] = 0xb0fb0e4e;
  return;
}

Assistant:

static void sm3_init(struct sm3_context *ctx)
{
	ctx->total[0] = 0;
	ctx->total[1] = 0;

	ctx->state[0] = 0x7380166F;
	ctx->state[1] = 0x4914B2B9;
	ctx->state[2] = 0x172442D7;
	ctx->state[3] = 0xDA8A0600;
	ctx->state[4] = 0xA96F30BC;
	ctx->state[5] = 0x163138AA;
	ctx->state[6] = 0xE38DEE4D;
	ctx->state[7] = 0xB0FB0E4E;
}